

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl.h
# Opt level: O0

void avl_balance_tree(avl_node_t **node)

{
  int iVar1;
  avl_node_t *paVar2;
  int factor;
  avl_node_t **node_local;
  
  iVar1 = avl_update_height_get_balance(*node);
  if (iVar1 < 2) {
    if (iVar1 < -1) {
      iVar1 = avl_get_balance((*node)->right);
      if (iVar1 < 0) {
        paVar2 = avl_rotate_RR(*node);
        *node = paVar2;
      }
      else {
        paVar2 = avl_rotate_RL(*node);
        *node = paVar2;
      }
    }
  }
  else {
    iVar1 = avl_get_balance((*node)->left);
    if (iVar1 < 1) {
      paVar2 = avl_rotate_LR(*node);
      *node = paVar2;
    }
    else {
      paVar2 = avl_rotate_LL(*node);
      *node = paVar2;
    }
  }
  return;
}

Assistant:

static void
avl_balance_tree(avl_node_t **node)
{
    int factor = avl_update_height_get_balance(*node);

    if (factor > 1) {
        if (avl_get_balance((*node)->left) > 0) *node = avl_rotate_LL(*node);
        else *node = avl_rotate_LR(*node);
    } else if (factor < -1) {
        if (avl_get_balance((*node)->right) < 0) *node = avl_rotate_RR(*node);
        else *node = avl_rotate_RL(*node);
    }
}